

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallNormalHeapBlock.cpp
# Opt level: O1

uint Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>::CalculateMarkCountForPage
               (SmallHeapBlockBitVector *markBits,uint bucketIndex,uint pageStartBitIndex)

{
  ulong *puVar1;
  undefined4 *puVar2;
  code *pcVar3;
  bool bVar4;
  BVIndex BVar5;
  BVStatic<256UL> *this;
  long lVar6;
  undefined8 *in_FS_OFFSET;
  Type TStack_48;
  SmallHeapBlockBitVector temp;
  
  temp.data[1].word = 0;
  temp.data[2].word = 0;
  TStack_48.word = 0;
  temp.data[0].word = 0;
  if (0x2f < bucketIndex) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.h"
                       ,0x186,"(index < TBlockAttributes::BucketCount)",
                       "index < TBlockAttributes::BucketCount");
    if (!bVar4) goto LAB_0029e9a1;
    *puVar2 = 0;
  }
  js_memcpy_s(&TStack_48,0x20,markBits,0x20);
  lVar6 = 0;
  do {
    puVar1 = (ulong *)((long)(temp.data + -1) + lVar6);
    *puVar1 = *puVar1 & ~*(ulong *)((ulong)bucketIndex * 0x20 + 0x3978c8 + lVar6);
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x20);
  if ((char)pageStartBitIndex != '\0') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBlock.cpp"
                       ,0xa4,"(pageStartBitIndex % HeapBlockMap32::PageMarkBitCount == 0)",
                       "pageStartBitIndex % HeapBlockMap32::PageMarkBitCount == 0");
    if (!bVar4) {
LAB_0029e9a1:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar2 = 0;
  }
  this = BVStatic<256ul>::GetRange<256ul>((BVStatic<256ul> *)&TStack_48,pageStartBitIndex);
  BVar5 = BVStatic<256UL>::Count(this);
  return BVar5;
}

Assistant:

uint
SmallNormalHeapBlockT<TBlockAttributes>::CalculateMarkCountForPage(SmallHeapBlockBitVector * markBits, uint bucketIndex, uint pageStartBitIndex)
{
    SmallHeapBlockBitVector temp;
    SmallHeapBlockBitVector const* invalid = HeapInfo::GetInvalidBitVectorForBucket<TBlockAttributes>(bucketIndex);

    // Remove any invalid bits from the calculation
    temp.Copy(markBits);
    temp.Minus(invalid);

    Assert(pageStartBitIndex % HeapBlockMap32::PageMarkBitCount == 0);
    uint rescanMarkCount = temp.template GetRange<HeapBlockMap32::PageMarkBitCount>(pageStartBitIndex)->Count();

    // If the first object on the page is not at the start of the page, then the object containing
    // the first few bytes of the page is not included in this mark count
    // The caller will have to account for this
    return rescanMarkCount;
}